

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hostref.c
# Opt level: O2

void check(wasm_ref_t *actual,wasm_ref_t *expected)

{
  char cVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  
  if (actual == expected) {
    if (actual == (wasm_ref_t *)0x0) {
      return;
    }
LAB_00102842:
    wasm_ref_delete(actual);
    return;
  }
  if ((actual == (wasm_ref_t *)0x0) || (expected == (wasm_ref_t *)0x0)) {
    if (expected == (wasm_ref_t *)0x0) {
      uVar2 = 0;
      goto LAB_0010286e;
    }
  }
  else {
    cVar1 = wasm_ref_same(actual,expected);
    if (cVar1 != '\0') goto LAB_00102842;
  }
  uVar2 = wasm_ref_get_host_info(expected);
LAB_0010286e:
  if (actual == (wasm_ref_t *)0x0) {
    uVar3 = 0;
  }
  else {
    uVar3 = wasm_ref_get_host_info(actual);
  }
  printf("> Error reading reference, expected %p, got %p\n",uVar2,uVar3);
  exit(1);
}

Assistant:

void check(own wasm_ref_t* actual, const wasm_ref_t* expected) {
  if (actual != expected &&
      !(actual && expected && wasm_ref_same(actual, expected))) {
    printf("> Error reading reference, expected %p, got %p\n",
      expected ? wasm_ref_get_host_info(expected) : NULL,
      actual ? wasm_ref_get_host_info(actual) : NULL);
    exit(1);
  }
  if (actual) wasm_ref_delete(actual);
}